

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_number.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Tojarar[P]cJSON/tests/print_number.c"
            );
  UnityDefaultTestRun(print_number_should_print_zero,"print_number_should_print_zero",0x60);
  UnityDefaultTestRun(print_number_should_print_negative_integers,
                      "print_number_should_print_negative_integers",0x61);
  UnityDefaultTestRun(print_number_should_print_positive_integers,
                      "print_number_should_print_positive_integers",0x62);
  UnityDefaultTestRun(print_number_should_print_positive_reals,
                      "print_number_should_print_positive_reals",99);
  UnityDefaultTestRun(print_number_should_print_negative_reals,
                      "print_number_should_print_negative_reals",100);
  UnityDefaultTestRun(print_number_should_print_non_number,"print_number_should_print_non_number",
                      0x65);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
    /* initialize cJSON item */
    UNITY_BEGIN();

    RUN_TEST(print_number_should_print_zero);
    RUN_TEST(print_number_should_print_negative_integers);
    RUN_TEST(print_number_should_print_positive_integers);
    RUN_TEST(print_number_should_print_positive_reals);
    RUN_TEST(print_number_should_print_negative_reals);
    RUN_TEST(print_number_should_print_non_number);

    return UNITY_END();
}